

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  Event *this;
  Event *this_00;
  Event *this_01;
  Handle *this_02;
  Handle *s;
  EventHandle *touchHandle;
  EventHandle *keyHandle;
  Event *eunknown;
  Event *etouch;
  Event *ekey;
  char **argv_local;
  int argc_local;
  
  this = (Event *)operator_new(0x10);
  Event::Event(this,TYPE_KEY);
  this_00 = (Event *)operator_new(0x10);
  Event::Event(this_00,TYPE_TOUCH);
  this_01 = (Event *)operator_new(0x10);
  Event::Event(this_01,TYPE_UNKNOWN);
  this_02 = (Handle *)operator_new(0x10);
  KeyEventHandle::KeyEventHandle((KeyEventHandle *)this_02);
  s = (Handle *)operator_new(0x10);
  TouchEventHandle::TouchEventHandle((TouchEventHandle *)s);
  Handle::setSuccessor(this_02,s);
  printf("case keyHandle:\n");
  (*this_02->_vptr_Handle[2])(this_02,this);
  (*this_02->_vptr_Handle[2])(this_02,this_00);
  (*this_02->_vptr_Handle[2])(this_02,this_01);
  printf("case touchHandle:\n");
  (*s->_vptr_Handle[2])(s,this);
  (*s->_vptr_Handle[2])(s,this_00);
  (*s->_vptr_Handle[2])(s,this_01);
  if (this != (Event *)0x0) {
    (*this->_vptr_Event[1])();
  }
  if (this_00 != (Event *)0x0) {
    (*this_00->_vptr_Event[1])();
  }
  if (this_01 != (Event *)0x0) {
    (*this_01->_vptr_Event[1])();
  }
  if (this_02 != (Handle *)0x0) {
    (*this_02->_vptr_Handle[1])();
  }
  if (s != (Handle *)0x0) {
    (*s->_vptr_Handle[1])();
  }
  return 0;
}

Assistant:

int main(int argc, char** argv)
{
	Event* ekey = new Event(Event::TYPE_KEY);
	Event* etouch = new Event(Event::TYPE_TOUCH);
	Event* eunknown = new Event();

	EventHandle* keyHandle = new KeyEventHandle();
	EventHandle* touchHandle = new TouchEventHandle();

	keyHandle->setSuccessor(touchHandle);


	printf("case keyHandle:\n");
	keyHandle->onHandleEvent(ekey);
	keyHandle->onHandleEvent(etouch);
	keyHandle->onHandleEvent(eunknown);

	printf("case touchHandle:\n");
	touchHandle->onHandleEvent(ekey);
	touchHandle->onHandleEvent(etouch);
	touchHandle->onHandleEvent(eunknown);

	delete ekey;
	delete etouch;
	delete eunknown;

	delete keyHandle;
	delete touchHandle;

	return 0;
}